

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opusfile.c
# Opt level: O0

int op_make_decode_ready(OggOpusFile *_of)

{
  OggOpusLink *pOVar1;
  int iVar2;
  undefined8 uVar3;
  int local_38;
  undefined1 local_34 [4];
  int local_30;
  int err;
  int channel_count;
  int coupled_count;
  int stream_count;
  int li;
  OpusHead *head;
  OggOpusFile *_of_local;
  
  if (3 < _of->ready_state) {
    return 0;
  }
  if (2 < _of->ready_state) {
    if (_of->seekable == 0) {
      local_38 = 0;
    }
    else {
      local_38 = _of->cur_link;
    }
    coupled_count = local_38;
    pOVar1 = _of->links;
    _stream_count = &pOVar1[local_38].head;
    channel_count = pOVar1[local_38].head.stream_count;
    err = pOVar1[local_38].head.coupled_count;
    local_30 = pOVar1[local_38].head.channel_count;
    head = (OpusHead *)_of;
    if ((((_of->od == (OpusMSDecoder *)0x0) || (_of->od_stream_count != channel_count)) ||
        (_of->od_coupled_count != err)) ||
       ((_of->od_channel_count != local_30 ||
        (iVar2 = memcmp(_of->od_mapping,pOVar1[local_38].head.mapping,(long)local_30), iVar2 != 0)))
       ) {
      opus_multistream_decoder_destroy(*(undefined8 *)(head[0x2c].mapping + 0x78));
      uVar3 = opus_multistream_decoder_create
                        (48000,local_30,channel_count,err,_stream_count->mapping,local_34);
      *(undefined8 *)(head[0x2c].mapping + 0x78) = uVar3;
      if (*(long *)(head[0x2c].mapping + 0x78) == 0) {
        return -0x81;
      }
      *(int *)(head[0x2c].mapping + 0x90) = channel_count;
      *(int *)(head[0x2c].mapping + 0x94) = err;
      *(int *)(head[0x2c].mapping + 0x98) = local_30;
      memcpy(head[0x2c].mapping + 0x9c,_stream_count->mapping,(long)local_30);
    }
    else {
      opus_multistream_decoder_ctl(*(undefined8 *)(head[0x2c].mapping + 0x78),0xfbc);
    }
    head->mapping[0x58] = '\x04';
    head->mapping[0x59] = '\0';
    head->mapping[0x5a] = '\0';
    head->mapping[0x5b] = '\0';
    head->mapping[0x78] = '\0';
    head->mapping[0x79] = '\0';
    head->mapping[0x7a] = '\0';
    head->mapping[0x7b] = '\0';
    head->mapping[0x7c] = '\0';
    head->mapping[0x7d] = '\0';
    head->mapping[0x7e] = '\0';
    head->mapping[0x7f] = '\0';
    head->mapping[0x80] = '\0';
    head->mapping[0x81] = '\0';
    head->mapping[0x82] = '\0';
    head->mapping[0x83] = '\0';
    head->mapping[0x84] = '\0';
    head->mapping[0x85] = '\0';
    head->mapping[0x86] = '\0';
    head->mapping[0x87] = '\0';
    head[0x2d].mapping[0xcc] = '\0';
    head[0x2d].mapping[0xcd] = '\0';
    head[0x2d].mapping[0xce] = '\0';
    head[0x2d].mapping[0xcf] = '\0';
    *(undefined4 *)(head[0x2d].mapping + 0xc0) =
         *(undefined4 *)(*(long *)(head->mapping + 0x10) + (long)coupled_count * 0x178 + 0x30);
    op_update_gain((OggOpusFile *)head);
    return 0;
  }
  return -0x81;
}

Assistant:

static int op_make_decode_ready(OggOpusFile *_of){
  const OpusHead *head;
  int             li;
  int             stream_count;
  int             coupled_count;
  int             channel_count;
  if(_of->ready_state>OP_STREAMSET)return 0;
  if(OP_UNLIKELY(_of->ready_state<OP_STREAMSET))return OP_EFAULT;
  li=_of->seekable?_of->cur_link:0;
  head=&_of->links[li].head;
  stream_count=head->stream_count;
  coupled_count=head->coupled_count;
  channel_count=head->channel_count;
  /*Check to see if the current decoder is compatible with the current link.*/
  if(_of->od!=NULL&&_of->od_stream_count==stream_count
   &&_of->od_coupled_count==coupled_count&&_of->od_channel_count==channel_count
   &&memcmp(_of->od_mapping,head->mapping,
   sizeof(*head->mapping)*channel_count)==0){
    opus_multistream_decoder_ctl(_of->od,OPUS_RESET_STATE);
  }
  else{
    int err;
    opus_multistream_decoder_destroy(_of->od);
    _of->od=opus_multistream_decoder_create(48000,channel_count,
     stream_count,coupled_count,head->mapping,&err);
    if(_of->od==NULL)return OP_EFAULT;
    _of->od_stream_count=stream_count;
    _of->od_coupled_count=coupled_count;
    _of->od_channel_count=channel_count;
    memcpy(_of->od_mapping,head->mapping,sizeof(*head->mapping)*channel_count);
  }
  _of->ready_state=OP_INITSET;
  _of->bytes_tracked=0;
  _of->samples_tracked=0;
#if !defined(OP_FIXED_POINT)
  _of->state_channel_count=0;
  /*Use the serial number for the PRNG seed to get repeatable output for
     straight play-throughs.*/
  _of->dither_seed=_of->links[li].serialno;
#endif
  op_update_gain(_of);
  return 0;
}